

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int type_eq_p(type *type1,type *type2)

{
  arr_type *paVar1;
  arr_type *paVar2;
  byte *pbVar3;
  byte *pbVar4;
  func_type *pfVar5;
  func_type *pfVar6;
  node_t_conflict param;
  node_t_conflict param_00;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  decl_spec *pdVar10;
  decl_spec *pdVar11;
  anon_union_16_10_0af5b411_for_u *list;
  anon_union_16_10_0af5b411_for_u *list_00;
  bool bVar12;
  
LAB_0015b263:
  if ((type1->mode != type2->mode) ||
     (((*(byte *)&type2->type_qual ^ *(byte *)&type1->type_qual) & 0xf) != 0))
  goto switchD_0015b290_default;
  switch(type1->mode) {
  case TM_BASIC:
    bVar12 = (type1->u).basic_type == (type2->u).basic_type;
    break;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION:
    bVar12 = (type1->u).tag_type == (type2->u).tag_type;
    break;
  case TM_PTR:
    type1 = (type1->u).ptr_type;
    type2 = (type2->u).ptr_type;
    goto LAB_0015b263;
  case TM_ARR:
    paVar1 = (type2->u).arr_type;
    paVar2 = (type1->u).arr_type;
    if (((((((*(byte *)paVar1 ^ *(byte *)paVar2) & 1) == 0) &&
          (iVar7 = type_eq_p(paVar2->el_type,paVar1->el_type), iVar7 != 0)) &&
         (((*(byte *)&paVar1->ind_type_qual ^ *(byte *)&paVar2->ind_type_qual) & 0xf) == 0)) &&
        ((paVar2->size->code != N_IGNORE && (paVar1->size->code != N_IGNORE)))) &&
       ((pbVar3 = (byte *)paVar2->size->attr, (*pbVar3 & 1) != 0 &&
        ((pbVar4 = (byte *)paVar1->size->attr, (*pbVar4 & 1) != 0 &&
         (iVar7 = integer_type_p(*(type **)(pbVar4 + 0x18)), iVar7 != 0)))))) {
      bVar12 = *(long *)(pbVar3 + 0x30) == *(long *)(pbVar4 + 0x30);
      break;
    }
    goto switchD_0015b290_default;
  case TM_FUNC:
    pfVar5 = (type2->u).func_type;
    pfVar6 = (type1->u).func_type;
    if ((((*(byte *)pfVar5 ^ *(byte *)pfVar6) & 1) == 0) &&
       (iVar7 = type_eq_p(pfVar6->ret_type,pfVar5->ret_type), iVar7 != 0)) {
      list = &pfVar6->param_list->u;
      sVar8 = DLIST_node_t_length(&list->ops);
      list_00 = &pfVar5->param_list->u;
      sVar9 = DLIST_node_t_length(&list_00->ops);
      if (sVar8 == sVar9) goto LAB_0015b38b;
    }
switchD_0015b290_default:
    bVar12 = false;
    break;
  default:
    goto switchD_0015b290_default;
  }
LAB_0015b3ca:
  return (int)bVar12;
LAB_0015b38b:
  param = (list->ops).head;
  bVar12 = param == (node_t_conflict)0x0;
  if (bVar12) goto LAB_0015b3ca;
  param_00 = (list_00->ops).head;
  pdVar10 = get_param_decl_spec(param);
  pdVar11 = get_param_decl_spec(param_00);
  iVar7 = type_eq_p(pdVar10->type,pdVar11->type);
  if (iVar7 == 0) goto LAB_0015b3ca;
  list = (anon_union_16_10_0af5b411_for_u *)&(param->op_link).next;
  list_00 = (anon_union_16_10_0af5b411_for_u *)&(param_00->op_link).next;
  goto LAB_0015b38b;
}

Assistant:

static int type_eq_p (struct type *type1, struct type *type2) {
  if (type1->mode != type2->mode) return FALSE;
  if (!type_qual_eq_p (&type1->type_qual, &type2->type_qual)) return FALSE;
  switch (type1->mode) {
  case TM_BASIC: return type1->u.basic_type == type2->u.basic_type;
  case TM_ENUM:
  case TM_STRUCT:
  case TM_UNION: return type1->u.tag_type == type2->u.tag_type;
  case TM_PTR: return type_eq_p (type1->u.ptr_type, type2->u.ptr_type);
  case TM_ARR: {
    struct expr *cexpr1, *cexpr2;
    struct arr_type *at1 = type1->u.arr_type, *at2 = type2->u.arr_type;

    return (at1->static_p == at2->static_p && type_eq_p (at1->el_type, at2->el_type)
            && type_qual_eq_p (&at1->ind_type_qual, &at2->ind_type_qual)
            && at1->size->code != N_IGNORE && at2->size->code != N_IGNORE
            && (cexpr1 = at1->size->attr)->const_p && (cexpr2 = at2->size->attr)->const_p
            && integer_type_p (cexpr2->type) && integer_type_p (cexpr2->type)
            && cexpr1->c.i_val == cexpr2->c.i_val);
  }
  case TM_FUNC: {
    struct func_type *ft1 = type1->u.func_type, *ft2 = type2->u.func_type;
    struct decl_spec *ds1, *ds2;

    if (ft1->dots_p != ft2->dots_p || !type_eq_p (ft1->ret_type, ft2->ret_type)
        || NL_LENGTH (ft1->param_list->u.ops) != NL_LENGTH (ft2->param_list->u.ops))
      return FALSE;
    for (node_t p1 = NL_HEAD (ft1->param_list->u.ops), p2 = NL_HEAD (ft2->param_list->u.ops);
         p1 != NULL; p1 = NL_NEXT (p1), p2 = NL_NEXT (p2)) {
      ds1 = get_param_decl_spec (p1);
      ds2 = get_param_decl_spec (p2);
      if (!type_eq_p (ds1->type, ds2->type)) return FALSE;
      // ??? other qualifiers
    }
    return TRUE;
  }
  default: return FALSE;
  }
}